

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_switch::run_impl(statement_switch *this)

{
  undefined *puVar1;
  statement_block *psVar2;
  const_iterator cVar3;
  var key;
  undefined1 auStack_38 [16];
  size_t local_28;
  
  cs_debugger_step_callback(&this->super_statement_base);
  auStack_38._8_8_ = (this->mTree).mRoot;
  runtime_type::parse_expr
            ((runtime_type *)auStack_38,
             (iterator *)
             (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (bool)((char)auStack_38 + '\b'));
  cVar3 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
          ::find<cs_impl::any>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                      *)&this->mCases,(key_arg<cs_impl::any> *)auStack_38);
  puVar1 = current_process;
  if (cVar3.inner_.ctrl_ ==
      (this->mCases).
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
      .
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
      .ctrl_ + (this->mCases).
               super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
               .
               super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
               .capacity_) {
    psVar2 = this->mDefault;
    if (psVar2 == (statement_block *)0x0) goto LAB_0016e6b5;
    if ((*current_process & 1) != 0) {
      LOCK();
      *current_process = 0;
      UNLOCK();
      event_type::touch((event_type *)(puVar1 + 0xf8),(void *)0x0);
    }
  }
  else {
    phmap::priv::
    raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
    ::try_emplace_impl<cs_impl::any_const&>
              ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>::iterator,_bool>
                *)(auStack_38 + 8),&this->mCases,(any *)auStack_38);
    puVar1 = current_process;
    psVar2 = *(statement_block **)(local_28 + 8);
    if ((*current_process & 1) != 0) {
      LOCK();
      *current_process = 0;
      UNLOCK();
      event_type::touch((event_type *)(puVar1 + 0xf8),(void *)0x0);
    }
  }
  (*(psVar2->super_statement_base)._vptr_statement_base[3])(psVar2);
LAB_0016e6b5:
  cs_impl::any::recycle((any *)auStack_38);
  return;
}

Assistant:

void statement_switch::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		var key = context->instance->parse_expr(mTree.root());
		if (mCases.count(key) > 0)
			mCases[key]->run();
		else if (mDefault != nullptr)
			mDefault->run();
	}